

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kDefectiveBase.cpp
# Opt level: O2

void __thiscall KDefectiveBase::~KDefectiveBase(KDefectiveBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

KDefectiveBase::~KDefectiveBase() {
	delete[] from;
	delete[] dis;
    delete[] maxDis;
    delete[] isInPC;
	delete[] neiSet;
	delete[] neiSet2;
}